

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_iovec_t ikm;
  ptls_iovec_t pVar1;
  int iVar2;
  uint8_t *puVar3;
  byte local_9d;
  int local_9c;
  undefined1 auStack_98 [4];
  int ret;
  ptls_iovec_t ecdh_secret;
  st_ptls_server_hello_t sh;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  puVar3 = message.base;
  memset(auStack_98,0,0x10);
  local_9c = decode_server_hello(tls,(st_ptls_server_hello_t *)&ecdh_secret.len,puVar3 + 4,
                                 puVar3 + message.len);
  if (local_9c != 0) goto LAB_0012810c;
  if ((sh.legacy_session_id.base != (uint8_t *)(tls->field_18).client.legacy_session_id.len) ||
     (iVar2 = (*ptls_mem_equal)((void *)sh.random_._24_8_,
                                (tls->field_18).client.legacy_session_id.base,
                                (tls->field_18).client.legacy_session_id.len), iVar2 == 0)) {
    local_9c = 0x2f;
    goto LAB_0012810c;
  }
  if ((int)sh.legacy_session_id.len != 0) {
    local_9c = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
    if (local_9c == 0) {
      iVar2 = handle_hello_retry_request
                        (tls,emitter,(st_ptls_server_hello_t *)&ecdh_secret.len,message,properties);
      return iVar2;
    }
    goto LAB_0012810c;
  }
  local_9d = 0;
  if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
    local_9d = ((byte)tls->field_0x160 >> 1 & 1) != 0 ^ 0xff;
  }
  local_9c = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,(uint)(local_9d & 1));
  if ((local_9c != 0) ||
     ((sh._48_8_ != 0 &&
      (pVar1.len = (size_t)sh.field_3.peerkey.base, pVar1.base = (uint8_t *)sh._48_8_,
      local_9c = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                           (&(tls->field_18).client.key_share_ctx,1,(ptls_iovec_t *)auStack_98,pVar1
                           ), local_9c != 0)))) goto LAB_0012810c;
  ptls__key_schedule_update_hash(tls->key_schedule,puVar3,message.len);
  ikm.len = (size_t)ecdh_secret.base;
  ikm.base = _auStack_98;
  local_9c = key_schedule_extract(tls->key_schedule,ikm);
  if ((local_9c != 0) ||
     (local_9c = setup_traffic_protection(tls,0,"s hs traffic",2,0), local_9c != 0))
  goto LAB_0012810c;
  if (((tls->field_18).server.pending_traffic_secret[0x38] >> 1 & 1) == 0) {
    local_9c = setup_traffic_protection(tls,1,"c hs traffic",2,0);
joined_r0x001280f1:
    if (local_9c != 0) goto LAB_0012810c;
  }
  else {
    puVar3 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      local_9c = 0x201;
      goto LAB_0012810c;
    }
    local_9c = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if (local_9c != 0) goto LAB_0012810c;
    if (tls->ctx->update_traffic_key != (ptls_update_traffic_key_t *)0x0) {
      local_9c = (*tls->ctx->update_traffic_key->cb)
                           (tls->ctx->update_traffic_key,tls,1,2,tls->pending_handshake_secret);
      goto joined_r0x001280f1;
    }
  }
  tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
  local_9c = 0x202;
LAB_0012810c:
  if (_auStack_98 != (uint8_t *)0x0) {
    (*ptls_clear_memory)(_auStack_98,(size_t)ecdh_secret.base);
    free(_auStack_98);
  }
  return local_9c;
}

Assistant:

static int client_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
    struct st_ptls_server_hello_t sh;
    ptls_iovec_t ecdh_secret = {NULL};
    int ret;

    if ((ret = decode_server_hello(tls, &sh, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        goto Exit;
    if (!(sh.legacy_session_id.len == tls->client.legacy_session_id.len &&
          ptls_mem_equal(sh.legacy_session_id.base, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len))) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    if (sh.is_retry_request) {
        if ((ret = key_schedule_select_one(tls->key_schedule, tls->cipher_suite, 0)) != 0)
            goto Exit;
        return handle_hello_retry_request(tls, emitter, &sh, message, properties);
    }

    if ((ret = key_schedule_select_one(tls->key_schedule, tls->cipher_suite, tls->client.offered_psk && !tls->is_psk_handshake)) !=
        0)
        goto Exit;

    if (sh.peerkey.base != NULL) {
        if ((ret = tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, &ecdh_secret, sh.peerkey)) != 0)
            goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    if ((ret = key_schedule_extract(tls->key_schedule, ecdh_secret)) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 0, "s hs traffic", 2, 0)) != 0)
        goto Exit;
    if (tls->client.using_early_data) {
        if ((tls->pending_handshake_secret = malloc(PTLS_MAX_DIGEST_SIZE)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = derive_secret(tls->key_schedule, tls->pending_handshake_secret, "c hs traffic")) != 0)
            goto Exit;
        if (tls->ctx->update_traffic_key != NULL &&
            (ret = tls->ctx->update_traffic_key->cb(tls->ctx->update_traffic_key, tls, 1, 2, tls->pending_handshake_secret)) != 0)
            goto Exit;
    } else {
        if ((ret = setup_traffic_protection(tls, 1, "c hs traffic", 2, 0)) != 0)
            goto Exit;
    }

    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (ecdh_secret.base != NULL) {
        ptls_clear_memory(ecdh_secret.base, ecdh_secret.len);
        free(ecdh_secret.base);
    }
    return ret;
}